

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_allocator.cpp
# Opt level: O2

void __thiscall
duckdb::FixedSizeAllocator::Deserialize
          (FixedSizeAllocator *this,MetadataManager *metadata_manager,BlockPointer *block_pointer)

{
  pointer __p;
  unsigned_long uVar1;
  unsigned_long uVar2;
  __uniq_ptr_impl<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_> *this_00;
  bool bVar3;
  unsigned_long segment_count;
  BlockPointer buffer_block_pointer;
  unsigned_long allocation_size;
  unsigned_long buffer_id;
  MetadataReader reader;
  pointer local_d0;
  unsigned_long local_c8;
  BlockPointer local_c0;
  unsigned_long local_b0;
  unsigned_long local_a8;
  MetadataReader local_a0;
  
  MetadataReader::MetadataReader(&local_a0,metadata_manager,*block_pointer);
  uVar1 = ReadStream::Read<unsigned_long>(&local_a0.super_ReadStream);
  this->segment_size = uVar1;
  uVar1 = ReadStream::Read<unsigned_long>(&local_a0.super_ReadStream);
  uVar2 = ReadStream::Read<unsigned_long>(&local_a0.super_ReadStream);
  this->total_segment_count = 0;
  while (bVar3 = uVar1 != 0, uVar1 = uVar1 - 1, bVar3) {
    local_a8 = ReadStream::Read<unsigned_long>(&local_a0.super_ReadStream);
    local_c0 = ReadStream::Read<duckdb::BlockPointer>(&local_a0.super_ReadStream);
    local_c8 = ReadStream::Read<unsigned_long>(&local_a0.super_ReadStream);
    local_b0 = ReadStream::Read<unsigned_long>(&local_a0.super_ReadStream);
    make_uniq<duckdb::FixedSizeBuffer,duckdb::BlockManager&,unsigned_long&,unsigned_long&,duckdb::BlockPointer&>
              ((duckdb *)&local_d0,this->block_manager,&local_c8,&local_b0,&local_c0);
    this_00 = (__uniq_ptr_impl<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>
               *)::std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->buffers,&local_a8);
    __p = local_d0;
    local_d0 = (pointer)0x0;
    ::std::__uniq_ptr_impl<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>::
    reset(this_00,__p);
    ::std::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>::
    ~unique_ptr((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>_>
                 *)&local_d0);
    this->total_segment_count = this->total_segment_count + local_c8;
  }
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    uVar1 = ReadStream::Read<unsigned_long>(&local_a0.super_ReadStream);
    local_c0.block_id = uVar1;
    ::std::__detail::
    _Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)&this->buffers_with_free_space,(value_type *)&local_c0);
  }
  MetadataReader::~MetadataReader(&local_a0);
  return;
}

Assistant:

void FixedSizeAllocator::Deserialize(MetadataManager &metadata_manager, const BlockPointer &block_pointer) {
	MetadataReader reader(metadata_manager, block_pointer);
	segment_size = reader.Read<idx_t>();
	auto buffer_count = reader.Read<idx_t>();
	auto buffers_with_free_space_count = reader.Read<idx_t>();

	total_segment_count = 0;

	for (idx_t i = 0; i < buffer_count; i++) {
		auto buffer_id = reader.Read<idx_t>();
		auto buffer_block_pointer = reader.Read<BlockPointer>();
		auto segment_count = reader.Read<idx_t>();
		auto allocation_size = reader.Read<idx_t>();
		buffers[buffer_id] =
		    make_uniq<FixedSizeBuffer>(block_manager, segment_count, allocation_size, buffer_block_pointer);
		total_segment_count += segment_count;
	}
	for (idx_t i = 0; i < buffers_with_free_space_count; i++) {
		buffers_with_free_space.insert(reader.Read<idx_t>());
	}
}